

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O3

void __thiscall StringType::GenDynamicSize(StringType *this,Output *out_cc,Env *env,DataPtr *data)

{
  int iVar1;
  bool bVar2;
  ID *pIVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (FLAGS_pac_debug) {
    GenDynamicSize(this);
  }
  if (this->string_length_var_field_ == (Field *)0x0) {
    pIVar3 = (ID *)0x0;
  }
  else {
    pIVar3 = this->string_length_var_field_->id_;
  }
  bVar2 = Env::Evaluated(env,pIVar3);
  if (!bVar2) {
    (*(this->string_length_var_field_->super_DataDepElement)._vptr_DataDepElement[7])
              (this->string_length_var_field_,out_cc,env);
    iVar1 = *(int *)&(this->super_Type).field_0x18c;
    if (iVar1 == 1) {
      GenDynamicSizeRegEx(this,out_cc,env,data);
    }
    else if (iVar1 == 2) {
      GenDynamicSizeAnyStr(this,out_cc,env,data);
    }
    if ((this->super_Type).incremental_input_ == false) {
      bVar2 = Type::AddSizeVar(&this->super_Type,out_cc,env);
      if (bVar2) {
        pIVar3 = Type::size_var(&this->super_Type);
        pcVar4 = Env::LValue(env,pIVar3);
        if (this->string_length_var_field_ == (Field *)0x0) {
          pIVar3 = (ID *)0x0;
        }
        else {
          pIVar3 = this->string_length_var_field_->id_;
        }
        pcVar5 = Env::RValue(env,pIVar3);
        Output::println(out_cc,"%s = %s;",pcVar4,pcVar5);
        pIVar3 = Type::size_var(&this->super_Type);
        Env::SetEvaluated(env,pIVar3,true);
        return;
      }
    }
  }
  return;
}

Assistant:

void StringType::GenDynamicSize(Output* out_cc, Env* env, const DataPtr& data)
	{
	ASSERT(StaticSize(env) < 0);
	DEBUG_MSG("Generating dynamic size for string `%s'\n", value_var()->Name());

	if ( env->Evaluated(string_length_var()) )
		return;

	string_length_var_field_->GenTempDecls(out_cc, env);

	switch ( type_ )
		{
		case ANYSTR:
			GenDynamicSizeAnyStr(out_cc, env, data);
			break;
		case CSTR:
			ASSERT(0);
			break;
		case REGEX:
			// TODO: static size for a regular expression?
			GenDynamicSizeRegEx(out_cc, env, data);
			break;
		}

	if ( ! incremental_input() && AddSizeVar(out_cc, env) )
		{
		out_cc->println("%s = %s;", env->LValue(size_var()), env->RValue(string_length_var()));
		env->SetEvaluated(size_var());
		}
	}